

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void dfg_deploy_handler(CManager_conflict cm,CMConnection conn,void *vmsg,void *client_data,
                       attr_list attrs)

{
  int iVar1;
  EVstone EVar2;
  int iVar3;
  action_value aVar4;
  __pid_t _Var5;
  void *pvVar6;
  long lVar7;
  pthread_t pVar8;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  timespec ts_2;
  timespec ts_1;
  EVdeploy_ack_msg response_msg;
  CMFormat deploy_ack_msg;
  attr_list tmp_attrs;
  int j;
  int local_list [1024];
  int local_stone;
  timespec ts;
  auto_stone_list *auto_list;
  int auto_stones;
  int base;
  int i;
  EVdfg_deploy_ptr msg;
  event_path_data evp;
  EVclient client;
  CMFormat in_stack_ffffffffffffef18;
  FILE *pFVar9;
  CMConnection in_stack_ffffffffffffef20;
  event_path_data in_stack_ffffffffffffef28;
  CManager_conflict in_stack_ffffffffffffef30;
  FILE *in_stack_ffffffffffffef38;
  CManager in_stack_ffffffffffffef40;
  timespec local_10b8;
  undefined4 local_10a8;
  CMTraceType in_stack_ffffffffffffef5c;
  CManager in_stack_ffffffffffffef60;
  EVstone *in_stack_ffffffffffffef68;
  char *in_stack_ffffffffffffef70;
  undefined8 in_stack_ffffffffffffef78;
  undefined4 in_stack_ffffffffffffef80;
  int local_1078 [1027];
  undefined4 local_6c;
  timespec local_68;
  void *local_58;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  undefined8 *local_30;
  long local_10;
  long local_8;
  
  local_38 = *(long *)(in_RDI + 0x118);
  local_48 = *(int *)(local_38 + 0x10);
  local_4c = 0;
  local_40 = in_RDX;
  local_30 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_58 = INT_CMmalloc((size_t)in_stack_ffffffffffffef20);
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffef38 = *(FILE **)(local_8 + 0x120);
      _Var5 = getpid();
      in_stack_ffffffffffffef40 = (CManager)(long)_Var5;
      pVar8 = pthread_self();
      fprintf(in_stack_ffffffffffffef38,"P%lxT%lx - ",in_stack_ffffffffffffef40,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_68);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"Client %d getting Deploy message\n",
            (ulong)*(uint *)(local_30 + 6));
  }
  fflush(*(FILE **)(local_8 + 0x120));
  IntCManager_lock(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,
                   (int)((ulong)in_stack_ffffffffffffef30 >> 0x20));
  if (*(int *)(local_38 + 0x10) == 0) {
    pvVar6 = INT_CMmalloc((size_t)in_stack_ffffffffffffef20);
    *(void **)(local_38 + 0x18) = pvVar6;
  }
  else {
    pvVar6 = INT_CMrealloc(in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18);
    *(void **)(local_38 + 0x18) = pvVar6;
  }
  for (local_44 = 0; local_44 < *(int *)(local_40 + 8); local_44 = local_44 + 1) {
    *(undefined4 *)(*(long *)(local_38 + 0x18) + (long)(local_48 + local_44) * 8) =
         *(undefined4 *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40);
    EVar2 = INT_EValloc_stone(in_stack_ffffffffffffef30);
    *(EVstone *)(*(long *)(local_38 + 0x18) + 4 + (long)(local_48 + local_44) * 8) = EVar2;
  }
  *(int *)(local_38 + 0x10) = local_48 + local_44;
  for (local_44 = 0; local_44 < *(int *)(local_40 + 8); local_44 = local_44 + 1) {
    local_6c = *(undefined4 *)(*(long *)(local_38 + 0x18) + 4 + (long)(local_48 + local_44) * 8);
    if (*(long *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 8) != 0) {
      in_stack_ffffffffffffef78 =
           attr_list_from_string
                     (*(undefined8 *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 8));
      INT_EVset_attr_list(in_stack_ffffffffffffef30,
                          (EVstone)((ulong)in_stack_ffffffffffffef28 >> 0x20),
                          (attr_list)in_stack_ffffffffffffef20);
      free_attr_list(in_stack_ffffffffffffef78);
    }
    for (iVar1 = 0; iVar1 < *(int *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x18);
        iVar1 = iVar1 + 1) {
      if (*(int *)(*(long *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x20) +
                  (long)iVar1 * 4) == -1) {
        local_1078[iVar1] = -1;
      }
      else {
        iVar3 = lookup_local_stone(in_stack_ffffffffffffef28,
                                   (int)((ulong)in_stack_ffffffffffffef20 >> 0x20));
        local_1078[iVar1] = iVar3;
        if (local_1078[iVar1] == -1) {
          printf("Didn\'t found global stone %d\n",
                 (ulong)*(uint *)(*(long *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 +
                                           0x20) + (long)iVar1 * 4));
        }
      }
    }
    local_1078[*(int *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x18)] = -1;
    INT_EVassoc_general_action
              ((CManager_conflict)CONCAT44(iVar1,in_stack_ffffffffffffef80),
               (EVstone)((ulong)in_stack_ffffffffffffef78 >> 0x20),in_stack_ffffffffffffef70,
               in_stack_ffffffffffffef68);
    for (iVar1 = 0; iVar1 < *(int *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x30);
        iVar1 = iVar1 + 1) {
      INT_EVassoc_general_action
                ((CManager_conflict)CONCAT44(iVar1,in_stack_ffffffffffffef80),
                 (EVstone)((ulong)in_stack_ffffffffffffef78 >> 0x20),in_stack_ffffffffffffef70,
                 in_stack_ffffffffffffef68);
    }
    if (*(int *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x10) != -1) {
      local_58 = INT_CMrealloc(in_stack_ffffffffffffef20,(size_t)in_stack_ffffffffffffef18);
      *(undefined4 *)((long)local_58 + (long)local_4c * 0xc) = local_6c;
      *(undefined4 *)((long)local_58 + (long)local_4c * 0xc + 4) =
           *(undefined4 *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x10);
      *(undefined4 *)((long)local_58 + (long)local_4c * 0xc + 8) =
           *(undefined4 *)(*(long *)(local_40 + 0x10) + (long)local_44 * 0x40 + 0x14);
      local_4c = local_4c + 1;
    }
    aVar4 = action_type((char *)in_stack_ffffffffffffef18);
    if (aVar4 == Action_Terminal) {
      *(int *)((long)local_30 + 0x44) = *(int *)((long)local_30 + 0x44) + 1;
    }
  }
  *(undefined4 *)((long)local_58 + (long)local_4c * 0xc + 4) = 0xffffffff;
  if (local_10 != 0) {
    INT_CMlookup_format((CManager)*local_30,EVdfg_deploy_ack_format_list);
    iVar1 = (int)((ulong)in_stack_ffffffffffffef30 >> 0x20);
    INT_CMwrite(in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,(void *)0x162bda);
    iVar3 = CMtrace_val[0xd];
    if (*(long *)(local_8 + 0x120) == 0) {
      iVar3 = CMtrace_init(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar9 = *(FILE **)(local_8 + 0x120);
        _Var5 = getpid();
        lVar7 = (long)_Var5;
        pVar8 = pthread_self();
        fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
        iVar1 = (int)((ulong)lVar7 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_10a8);
        fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",
                CONCAT44(in_stack_ffffffffffffef5c,local_10a8),in_stack_ffffffffffffef60);
      }
      fprintf(*(FILE **)(local_8 + 0x120),"Client %d wrote deploy ack\n",
              (ulong)*(uint *)(local_30 + 6));
    }
    fflush(*(FILE **)(local_8 + 0x120));
    goto LAB_00162e07;
  }
  if (*(long *)(local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffef60,in_stack_ffffffffffffef5c);
    if (iVar1 != 0) goto LAB_00162d33;
LAB_00162df1:
    iVar1 = (int)((ulong)in_stack_ffffffffffffef30 >> 0x20);
  }
  else {
    if (CMtrace_val[0xd] == 0) goto LAB_00162df1;
LAB_00162d33:
    iVar1 = (int)((ulong)in_stack_ffffffffffffef30 >> 0x20);
    if (CMtrace_PID != 0) {
      pFVar9 = *(FILE **)(local_8 + 0x120);
      _Var5 = getpid();
      lVar7 = (long)_Var5;
      pVar8 = pthread_self();
      fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_10b8);
      fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_10b8.tv_sec,local_10b8.tv_nsec);
    }
    fprintf(*(FILE **)(local_8 + 0x120),"Client %d no master conn\n",(ulong)*(uint *)(local_30 + 6))
    ;
  }
  fflush(*(FILE **)(local_8 + 0x120));
LAB_00162e07:
  if (dfg_deploy_handler::first_time_deploy != 0) {
    dfg_deploy_handler::first_time_deploy = 0;
  }
  if (local_4c == 0) {
    free(local_58);
    local_58 = (void *)0x0;
  }
  local_30[9] = local_58;
  IntCManager_unlock(in_stack_ffffffffffffef40,(char *)in_stack_ffffffffffffef38,iVar1);
  return;
}

Assistant:

static void
dfg_deploy_handler(CManager cm, CMConnection conn, void *vmsg, 
		  void *client_data, attr_list attrs)
{
    EVclient client = (EVclient) client_data;
    event_path_data evp = cm->evp;
    (void) conn;
    (void) attrs;
    static int first_time_deploy = 1;
    EVdfg_deploy_ptr msg =  vmsg;
    int i, base = evp->stone_lookup_table_size;
    int auto_stones = 0;
    auto_stone_list *auto_list = malloc(sizeof(auto_stone_list));

    CMtrace_out(cm, EVdfgVerbose, "Client %d getting Deploy message\n", client->my_node_id);

    CManager_lock(cm);
    /* add stones to local lookup table */
    if (evp->stone_lookup_table_size == 0) {
	evp->stone_lookup_table = 
	    malloc(sizeof(evp->stone_lookup_table[0]) * msg->stone_count);
    } else {
	evp->stone_lookup_table = 
	    realloc(evp->stone_lookup_table,
		    sizeof(evp->stone_lookup_table[0]) * (msg->stone_count+base));
    }
    for (i=0; i < msg->stone_count; i++) {
	evp->stone_lookup_table[base + i].global_id = msg->stone_list[i].global_stone_id;
	evp->stone_lookup_table[base + i].local_id = INT_EValloc_stone(cm);
    }
    evp->stone_lookup_table_size = base + i;
    for (i=0; i < msg->stone_count; i++) {
	int local_stone = evp->stone_lookup_table[base + i].local_id;
	int local_list[1024]; /* List of output actions for this stone... better be enough */
	int j;
	if (msg->stone_list[i].attrs != NULL) {
	    attr_list tmp_attrs = attr_list_from_string(msg->stone_list[i].attrs);
	    INT_EVset_attr_list(cm, local_stone, tmp_attrs);
	    free_attr_list(tmp_attrs);
	}
	for (j=0; j < msg->stone_list[i].out_count; j++) {
	    if (msg->stone_list[i].out_links[j] != -1) {
		local_list[j] = lookup_local_stone(evp, msg->stone_list[i].out_links[j]);
		if (local_list[j] == -1) {
		    printf("Didn't found global stone %d\n", msg->stone_list[i].out_links[j]);
		}
	    } else {
		local_list[j] = -1;
	    }
	}
	local_list[msg->stone_list[i].out_count] = -1;
	INT_EVassoc_general_action(cm, local_stone, msg->stone_list[i].action, 
				   &local_list[0]);
	for (j=0; j < msg->stone_list[i].extra_actions; j++) {
	    INT_EVassoc_general_action(cm, local_stone, msg->stone_list[i].xactions[j], 
				       &local_list[0]);
	}	    
	if (msg->stone_list[i].period_secs != -1) {
	    auto_list= realloc(auto_list, sizeof(auto_list[0]) * (auto_stones+2));
	    auto_list[auto_stones].stone = local_stone;
	    auto_list[auto_stones].period_secs = msg->stone_list[i].period_secs;
	    auto_list[auto_stones].period_usecs = msg->stone_list[i].period_usecs;
	    auto_stones++;
	}
	if (action_type(msg->stone_list[i].action) == Action_Terminal) {
	    client->active_sink_count++;
	}
    }    
    auto_list[auto_stones].period_secs = -1;
    if (conn != NULL) {
	CMFormat deploy_ack_msg = INT_CMlookup_format(client->cm, EVdfg_deploy_ack_format_list);
	EVdeploy_ack_msg response_msg;
	response_msg.node_id = msg->canonical_name;
	INT_CMwrite(client->master_connection, deploy_ack_msg, &response_msg);
	CMtrace_out(cm, EVdfgVerbose, "Client %d wrote deploy ack\n", client->my_node_id);
    } else {
      	CMtrace_out(cm, EVdfgVerbose, "Client %d no master conn\n", client->my_node_id);
    }
    if (first_time_deploy) {
	first_time_deploy = 0;
    }
    if (auto_stones == 0) {
	free(auto_list);
	auto_list = NULL;
    }
    client->pending_auto_list = auto_list;
    
    CManager_unlock(cm);
}